

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsIis.h
# Opt level: O2

void __thiscall HighsIis::~HighsIis(HighsIis *this)

{
  CLI::std::_Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_>::~_Vector_base
            ((_Vector_base<HighsIisInfo,_std::allocator<HighsIisInfo>_> *)(this + 0x68));
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(this + 0x50));
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(this + 0x38));
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(this + 0x20));
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)(this + 8));
  return;
}

Assistant:

HighsIis() {}